

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O1

void __thiscall
boost::function1<void,_const_boost::debug::dbg_startup_info_&>::swap
          (function1<void,_const_boost::debug::dbg_startup_info_&> *this,
          function1<void,_const_boost::debug::dbg_startup_info_&> *other)

{
  function1<void,_const_boost::debug::dbg_startup_info_&> tmp;
  function1<void,_const_boost::debug::dbg_startup_info_&> local_30;
  
  if (other != this) {
    local_30.super_function_base.vtable = (vtable_base *)0x0;
    move_assign(&local_30,this);
    move_assign(this,other);
    move_assign(other,&local_30);
    ~function1(&local_30);
  }
  return;
}

Assistant:

void swap(BOOST_FUNCTION_FUNCTION& other)
    {
      if (&other == this)
        return;

      BOOST_FUNCTION_FUNCTION tmp;
      tmp.move_assign(*this);
      this->move_assign(other);
      other.move_assign(tmp);
    }